

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_DXT.c
# Opt level: O0

void compute_color_line_STDEV(uchar *uncompressed,int channels,float *point,float *direction)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float sum_gb;
  float sum_rb;
  float sum_rg;
  float sum_bb;
  float sum_gg;
  float sum_rr;
  float sum_b;
  float sum_g;
  float sum_r;
  int i;
  float inv_16;
  float *direction_local;
  float *point_local;
  int channels_local;
  uchar *uncompressed_local;
  
  sum_r = 0.0;
  sum_g = 0.0;
  sum_b = 0.0;
  sum_rr = 0.0;
  sum_gg = 0.0;
  sum_bb = 0.0;
  sum_rg = 0.0;
  sum_rb = 0.0;
  sum_gb = 0.0;
  for (i = 0; i < channels * 0x10; i = channels + i) {
    sum_r = (float)uncompressed[i] + sum_r;
    sum_rr = (float)((uint)uncompressed[i] * (uint)uncompressed[i]) + sum_rr;
    sum_g = (float)uncompressed[i + 1] + sum_g;
    sum_gg = (float)((uint)uncompressed[i + 1] * (uint)uncompressed[i + 1]) + sum_gg;
    sum_b = (float)uncompressed[i + 2] + sum_b;
    sum_bb = (float)((uint)uncompressed[i + 2] * (uint)uncompressed[i + 2]) + sum_bb;
    sum_rg = (float)((uint)uncompressed[i] * (uint)uncompressed[i + 1]) + sum_rg;
    sum_rb = (float)((uint)uncompressed[i] * (uint)uncompressed[i + 2]) + sum_rb;
    sum_gb = (float)((uint)uncompressed[i + 1] * (uint)uncompressed[i + 2]) + sum_gb;
  }
  fVar1 = sum_r * 0.0625;
  fVar2 = sum_g * 0.0625;
  fVar3 = sum_b * 0.0625;
  fVar4 = -(fVar1 * 16.0) * fVar1 + sum_rr;
  fVar5 = -(fVar2 * 16.0) * fVar2 + sum_gg;
  fVar6 = -(fVar3 * 16.0) * fVar3 + sum_bb;
  fVar7 = -(fVar1 * 16.0) * fVar2 + sum_rg;
  fVar8 = -(fVar1 * 16.0) * fVar3 + sum_rb;
  fVar9 = -(fVar2 * 16.0) * fVar3 + sum_gb;
  *point = fVar1;
  point[1] = fVar2;
  point[2] = fVar3;
  *direction = fVar8 * 3.1415927 + fVar4 * 1.0 + fVar7 * 2.7182817;
  direction[1] = fVar9 * 3.1415927 + fVar7 * 1.0 + fVar5 * 2.7182817;
  direction[2] = fVar6 * 3.1415927 + fVar8 * 1.0 + fVar9 * 2.7182817;
  fVar1 = *direction;
  fVar2 = direction[1];
  fVar3 = direction[2];
  *direction = fVar3 * fVar8 + fVar1 * fVar4 + fVar2 * fVar7;
  direction[1] = fVar3 * fVar9 + fVar1 * fVar7 + fVar2 * fVar5;
  direction[2] = fVar3 * fVar6 + fVar1 * fVar8 + fVar2 * fVar9;
  fVar1 = *direction;
  fVar2 = direction[1];
  fVar3 = direction[2];
  *direction = fVar3 * fVar8 + fVar1 * fVar4 + fVar2 * fVar7;
  direction[1] = fVar3 * fVar9 + fVar1 * fVar7 + fVar2 * fVar5;
  direction[2] = fVar3 * fVar6 + fVar1 * fVar8 + fVar2 * fVar9;
  return;
}

Assistant:

void compute_color_line_STDEV(
		const unsigned char *const uncompressed,
		int channels,
		float point[3], float direction[3] )
{
	const float inv_16 = 1.0f / 16.0f;
	int i;
	float sum_r = 0.0f, sum_g = 0.0f, sum_b = 0.0f;
	float sum_rr = 0.0f, sum_gg = 0.0f, sum_bb = 0.0f;
	float sum_rg = 0.0f, sum_rb = 0.0f, sum_gb = 0.0f;
	/*	calculate all data needed for the covariance matrix
		( to compare with _rygdxt code)	*/
	for( i = 0; i < 16*channels; i += channels )
	{
		sum_r += uncompressed[i+0];
		sum_rr += uncompressed[i+0] * uncompressed[i+0];
		sum_g += uncompressed[i+1];
		sum_gg += uncompressed[i+1] * uncompressed[i+1];
		sum_b += uncompressed[i+2];
		sum_bb += uncompressed[i+2] * uncompressed[i+2];
		sum_rg += uncompressed[i+0] * uncompressed[i+1];
		sum_rb += uncompressed[i+0] * uncompressed[i+2];
		sum_gb += uncompressed[i+1] * uncompressed[i+2];
	}
	/*	convert the sums to averages	*/
	sum_r *= inv_16;
	sum_g *= inv_16;
	sum_b *= inv_16;
	/*	and convert the squares to the squares of the value - avg_value	*/
	sum_rr -= 16.0f * sum_r * sum_r;
	sum_gg -= 16.0f * sum_g * sum_g;
	sum_bb -= 16.0f * sum_b * sum_b;
	sum_rg -= 16.0f * sum_r * sum_g;
	sum_rb -= 16.0f * sum_r * sum_b;
	sum_gb -= 16.0f * sum_g * sum_b;
	/*	the point on the color line is the average	*/
	point[0] = sum_r;
	point[1] = sum_g;
	point[2] = sum_b;
	#if USE_COV_MAT
	/*
		The following idea was from ryg.
		(https://mollyrocket.com/forums/viewtopic.php?t=392)
		The method worked great (less RMSE than mine) most of
		the time, but had some issues handling some simple
		boundary cases, like full green next to full red,
		which would generate a covariance matrix like this:

		| 1  -1  0 |
		| -1  1  0 |
		| 0   0  0 |

		For a given starting vector, the power method can
		generate all zeros!  So no starting with {1,1,1}
		as I was doing!  This kind of error is still a
		slight posibillity, but will be very rare.
	*/
	/*	use the covariance matrix directly
		(1st iteration, don't use all 1.0 values!)	*/
	sum_r = 1.0f;
	sum_g = 2.718281828f;
	sum_b = 3.141592654f;
	direction[0] = sum_r*sum_rr + sum_g*sum_rg + sum_b*sum_rb;
	direction[1] = sum_r*sum_rg + sum_g*sum_gg + sum_b*sum_gb;
	direction[2] = sum_r*sum_rb + sum_g*sum_gb + sum_b*sum_bb;
	/*	2nd iteration, use results from the 1st guy	*/
	sum_r = direction[0];
	sum_g = direction[1];
	sum_b = direction[2];
	direction[0] = sum_r*sum_rr + sum_g*sum_rg + sum_b*sum_rb;
	direction[1] = sum_r*sum_rg + sum_g*sum_gg + sum_b*sum_gb;
	direction[2] = sum_r*sum_rb + sum_g*sum_gb + sum_b*sum_bb;
	/*	3rd iteration, use results from the 2nd guy	*/
	sum_r = direction[0];
	sum_g = direction[1];
	sum_b = direction[2];
	direction[0] = sum_r*sum_rr + sum_g*sum_rg + sum_b*sum_rb;
	direction[1] = sum_r*sum_rg + sum_g*sum_gg + sum_b*sum_gb;
	direction[2] = sum_r*sum_rb + sum_g*sum_gb + sum_b*sum_bb;
	#else
	/*	use my standard deviation method
		(very robust, a tiny bit slower and less accurate)	*/
	direction[0] = sqrt( sum_rr );
	direction[1] = sqrt( sum_gg );
	direction[2] = sqrt( sum_bb );
	/*	which has a greater component	*/
	if( sum_gg > sum_rr )
	{
		/*	green has greater component, so base the other signs off of green	*/
		if( sum_rg < 0.0f )
		{
			direction[0] = -direction[0];
		}
		if( sum_gb < 0.0f )
		{
			direction[2] = -direction[2];
		}
	} else
	{
		/*	red has a greater component	*/
		if( sum_rg < 0.0f )
		{
			direction[1] = -direction[1];
		}
		if( sum_rb < 0.0f )
		{
			direction[2] = -direction[2];
		}
	}
	#endif
}